

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O2

mecab_learner_node_t * __thiscall
MeCab::Tokenizer<mecab_learner_node_t,_mecab_learner_path_t>::getEOSNode
          (Tokenizer<mecab_learner_node_t,_mecab_learner_path_t> *this,
          Allocator<mecab_learner_node_t,_mecab_learner_path_t> *allocator)

{
  mecab_learner_node_t *pmVar1;
  
  pmVar1 = getBOSNode(this,allocator);
  pmVar1->stat = '\x03';
  return pmVar1;
}

Assistant:

N *Tokenizer<N, P>::getEOSNode(Allocator<N, P> *allocator) const {
  N *eos_node = getBOSNode(allocator);  // same
  eos_node->stat = MECAB_EOS_NODE;
  return eos_node;
}